

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_opt_set_params(int np,ggml_tensor **ps,float *x)

{
  ggml_tensor *pgVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  uVar4 = (ulong)(uint)np;
  if (np < 1) {
    uVar4 = 0;
  }
  lVar6 = 0;
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    pgVar1 = ps[uVar3];
    iVar2 = pgVar1->ne[1] * pgVar1->ne[0] * pgVar1->ne[2] * pgVar1->ne[3];
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (lVar5 = 0; iVar2 != (int)lVar5; lVar5 = lVar5 + 1) {
      ggml_set_f32_1d(ps[uVar3],(int)lVar5,x[(int)lVar6 + lVar5]);
    }
    lVar6 = (int)lVar6 + lVar5;
  }
  return;
}

Assistant:

static void ggml_opt_set_params(int np, struct ggml_tensor * const ps[], const float * x) {
    int i = 0;
    for (int p = 0; p < np; ++p) {
        const int ne = ggml_nelements(ps[p]) ;
        // TODO: add function to set tensor from array
        for (int j = 0; j < ne; ++j) {
            ggml_set_f32_1d(ps[p], j, x[i++]);
        }
    }
}